

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

GenerateBlockSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::GenerateBlockSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::syntax::NamedLabelSyntax*&,slang::parsing::Token&,slang::syntax::NamedBlockClauseSyntax*&,slang::syntax::SyntaxList<slang::syntax::MemberSyntax>const&,slang::parsing::Token&,slang::syntax::NamedBlockClauseSyntax*&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          NamedLabelSyntax **args_1,Token *args_2,NamedBlockClauseSyntax **args_3,
          SyntaxList<slang::syntax::MemberSyntax> *args_4,Token *args_5,
          NamedBlockClauseSyntax **args_6)

{
  Token begin;
  Token end;
  GenerateBlockSyntax *this_00;
  SyntaxList<slang::syntax::MemberSyntax> *args_local_4;
  NamedBlockClauseSyntax **args_local_3;
  Token *args_local_2;
  NamedLabelSyntax **args_local_1;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_local;
  BumpAllocator *this_local;
  
  this_00 = (GenerateBlockSyntax *)allocate(this,0xa8,8);
  begin.kind = args_2->kind;
  begin._2_1_ = args_2->field_0x2;
  begin.numFlags.raw = (args_2->numFlags).raw;
  begin.rawLen = args_2->rawLen;
  begin.info = args_2->info;
  end.kind = args_5->kind;
  end._2_1_ = args_5->field_0x2;
  end.numFlags.raw = (args_5->numFlags).raw;
  end.rawLen = args_5->rawLen;
  end.info = args_5->info;
  slang::syntax::GenerateBlockSyntax::GenerateBlockSyntax
            (this_00,args,*args_1,begin,*args_3,args_4,end,*args_6);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }